

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O3

bool __thiscall
GmmLib::GmmTextureCalc::GetRedescribedPlaneParams
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_YUV_PLANE PlaneType,
          GMM_TEXTURE_INFO *pRedescribedTexInfo)

{
  undefined1 *puVar1;
  uint32_t uVar2;
  uint8_t uVar3;
  bool bVar4;
  uint uVar5;
  GMM_RESOURCE_FORMAT GVar6;
  ulong uVar7;
  GMM_GFX_SIZE_T GVar8;
  
  GmmGetPlatformInfo(this->pGmmLibContext);
  memcpy(pRedescribedTexInfo,pTexInfo,0x208);
  puVar1 = &(pRedescribedTexInfo->Flags).Info.field_0x3;
  *puVar1 = *puVar1 & 0xef;
  uVar3 = GmmIsUVPacked(pTexInfo->Format);
  if (uVar3 == '\0') {
    if ((PlaneType & ~GMM_PLANE_3D_Y1) == GMM_PLANE_3D_UV0) {
      bVar4 = false;
      switch(pTexInfo->Format) {
      case GMM_FORMAT_IMC1:
      case GMM_FORMAT_IMC2:
      case GMM_FORMAT_IMC3:
      case GMM_FORMAT_IMC4:
      case GMM_FORMAT_MFX_JPEG_YUV420:
        goto switchD_001ac2bf_caseD_151;
      default:
        goto switchD_001ac2bf_caseD_155;
      case GMM_FORMAT_MFX_JPEG_YUV411:
        uVar7 = pTexInfo->BaseWidth + 3 >> 2;
        goto LAB_001ac32e;
      case GMM_FORMAT_MFX_JPEG_YUV411R:
        uVar5 = pTexInfo->BaseHeight + 3 >> 2;
        break;
      case GMM_FORMAT_MFX_JPEG_YUV422H:
        goto switchD_001ac2bf_caseD_159;
      case GMM_FORMAT_MFX_JPEG_YUV422V:
switchD_001ac2bf_caseD_15a:
        uVar5 = pTexInfo->BaseHeight + 1 >> 1;
      }
      pRedescribedTexInfo->BaseHeight = uVar5;
    }
  }
  else if ((PlaneType & ~GMM_PLANE_3D_Y1) == GMM_PLANE_3D_UV0) {
    GVar6 = pTexInfo->Format;
    if ((int)GVar6 < 0x163) {
      if (GVar6 - GMM_FORMAT_P010 < 3) {
        pRedescribedTexInfo->BitsPerPixel = 0x20;
      }
      else {
        if (1 < GVar6 - GMM_FORMAT_NV12) {
          return false;
        }
        pRedescribedTexInfo->BitsPerPixel = 0x10;
      }
switchD_001ac2bf_caseD_151:
      pRedescribedTexInfo->BaseWidth = pTexInfo->BaseWidth + 1 >> 1;
      goto switchD_001ac2bf_caseD_15a;
    }
    if (GVar6 == GMM_FORMAT_P208) {
      pRedescribedTexInfo->BitsPerPixel = 0x10;
    }
    else {
      if (GVar6 != GMM_FORMAT_P216) {
        return false;
      }
      pRedescribedTexInfo->BitsPerPixel = 0x20;
    }
switchD_001ac2bf_caseD_159:
    uVar7 = pTexInfo->BaseWidth + 1 >> 1;
LAB_001ac32e:
    pRedescribedTexInfo->BaseWidth = uVar7;
  }
  SetTileMode(this,pRedescribedTexInfo);
  uVar2 = pRedescribedTexInfo->BitsPerPixel;
  if (uVar2 == 8) {
    GVar6 = GMM_FORMAT_R8_UINT;
  }
  else if (uVar2 == 0x20) {
    GVar6 = GMM_FORMAT_R32_UINT;
  }
  else {
    if (uVar2 != 0x10) {
      return false;
    }
    GVar6 = GMM_FORMAT_R16_UINT;
  }
  pRedescribedTexInfo->Format = GVar6;
  if (pTexInfo->ArraySize < 2) {
    uVar2 = (pTexInfo->Alignment).VAlign;
    GVar8 = (ulong)(-uVar2 & (pRedescribedTexInfo->BaseHeight - 1) + uVar2) * pTexInfo->Pitch;
  }
  else {
    (pRedescribedTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
    uVar2 = (pTexInfo->Alignment).VAlign;
    uVar5 = -uVar2 & (pRedescribedTexInfo->BaseHeight - 1) + uVar2;
    (pRedescribedTexInfo->Alignment).QPitch = uVar5;
    GVar8 = pTexInfo->Pitch * (ulong)uVar5;
    (pRedescribedTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = GVar8;
    (pRedescribedTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = GVar8;
    GVar8 = (ulong)pTexInfo->ArraySize * (ulong)uVar5 * pTexInfo->Pitch;
  }
  pRedescribedTexInfo->Size = GVar8;
  bVar4 = true;
switchD_001ac2bf_caseD_155:
  return bVar4;
}

Assistant:

bool GmmLib::GmmTextureCalc::GetRedescribedPlaneParams(GMM_TEXTURE_INFO *pTexInfo, GMM_YUV_PLANE PlaneType, GMM_TEXTURE_INFO *pRedescribedTexInfo)
{
    GMM_STATUS               Status = GMM_SUCCESS;
    GMM_TEXTURE_INFO         TexInfoUVPlane;
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(pTexInfo->Flags.Info.RedecribedPlanes);
    __GMM_ASSERT(pRedescribedTexInfo);

    *pRedescribedTexInfo                             = *pTexInfo;
    pRedescribedTexInfo->Flags.Info.RedecribedPlanes = 0;
#ifdef _WIN32
    memcpy_s(&TexInfoUVPlane, sizeof(GMM_TEXTURE_INFO), pTexInfo, sizeof(GMM_TEXTURE_INFO));
#else
    memcpy(&TexInfoUVPlane, pTexInfo, sizeof(GMM_TEXTURE_INFO));
#endif // _WIN32

    if(GmmIsUVPacked(pTexInfo->Format))
    {
        // UV packed resources must have two seperate
        // tiling modes per plane, due to the packed
        // UV plane having twice the bits per pixel
        // as the Y plane.
        if((PlaneType == GMM_PLANE_U) || (PlaneType == GMM_PLANE_V))
        {
            switch(pTexInfo->Format)
            {
                // GMM_FORMAT_NV11  :                               linear format, no tiling supported, hence no redescription supported
                case GMM_FORMAT_NV12:
                case GMM_FORMAT_NV21:
                    pRedescribedTexInfo->BitsPerPixel = 16;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    pRedescribedTexInfo->BaseHeight   = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_P208:
                    pRedescribedTexInfo->BitsPerPixel = 16;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    // same base height as main surface
                    break;
                case GMM_FORMAT_P010:
                case GMM_FORMAT_P012:
                case GMM_FORMAT_P016:
                    pRedescribedTexInfo->BitsPerPixel = 32;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    pRedescribedTexInfo->BaseHeight   = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_P216:
                    pRedescribedTexInfo->BitsPerPixel = 32;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    // same base height as main surface
                    break;
                default:
                    GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
                    Status = GMM_INVALIDPARAM;
                    goto ERROR_CASE;
                    break;
            }
        }
    }
    else
    {
        // Non-UV packed surfaces TileMode of each plane is same as that of pTexInfo
        if((PlaneType == GMM_PLANE_U) || (PlaneType == GMM_PLANE_V))
        { // Non-UV packed surfaces only require the plane descriptors have proper height and width for each plane
            switch(pTexInfo->Format)
            {
                case GMM_FORMAT_IMC1:
                case GMM_FORMAT_IMC2:
                case GMM_FORMAT_IMC3:
                case GMM_FORMAT_IMC4:
                case GMM_FORMAT_MFX_JPEG_YUV420:
                    pRedescribedTexInfo->BaseWidth  = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    pRedescribedTexInfo->BaseHeight = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV422V:
                    pRedescribedTexInfo->BaseHeight = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE:
                    pRedescribedTexInfo->BaseHeight = GFX_CEIL_DIV(pTexInfo->BaseHeight, 4);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV411:
                    pRedescribedTexInfo->BaseWidth = GFX_CEIL_DIV(pTexInfo->BaseWidth, 4);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV422H:
                    pRedescribedTexInfo->BaseWidth = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    break;
                default:
                    GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
                    Status = GMM_INVALIDPARAM;
                    goto ERROR_CASE;
                    break;
            }
        }
    }

    SetTileMode(pRedescribedTexInfo);
    switch(pRedescribedTexInfo->BitsPerPixel)
    {
        case 8:
            pRedescribedTexInfo->Format = GMM_FORMAT_R8_UINT;
            break;
        case 16:
            pRedescribedTexInfo->Format = GMM_FORMAT_R16_UINT;
            break;
        case 32:
            pRedescribedTexInfo->Format = GMM_FORMAT_R32_UINT;
            break;
        default:
            GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
            Status = GMM_INVALIDPARAM;
            goto ERROR_CASE;
            break;
    }
    if(pTexInfo->ArraySize > 1)
    {
        pRedescribedTexInfo->OffsetInfo.Plane.ArrayQPitch = 0; // no longer a planar format on redescription
        pRedescribedTexInfo->Alignment.QPitch             = GFX_ALIGN(pRedescribedTexInfo->BaseHeight, pTexInfo->Alignment.VAlign);
        pRedescribedTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
        pRedescribedTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock = pRedescribedTexInfo->Alignment.QPitch * pTexInfo->Pitch;
        pRedescribedTexInfo->Size                                           = pRedescribedTexInfo->Alignment.QPitch * pTexInfo->Pitch * pTexInfo->ArraySize;
    }
    else
    {
        pRedescribedTexInfo->Size = (GFX_ALIGN(pRedescribedTexInfo->BaseHeight, pTexInfo->Alignment.VAlign)) * pTexInfo->Pitch;
    }

ERROR_CASE:
    return (Status == GMM_SUCCESS) ? true : false;
}